

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deInt32 *pdVar1;
  ostringstream *poVar2;
  PlatformInterface *pPVar3;
  Handle<(vk::HandleType)18> object;
  int iVar4;
  void *__s;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar5;
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar6;
  Checked<vk::Handle<(vk::HandleType)18>_> CVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  Parameters *extraout_RDX;
  char **value;
  char *pcVar11;
  qpTestLog *pqVar12;
  ProgramBinary *pPVar13;
  deUint32 numPassingAllocs;
  long lVar14;
  bool bVar15;
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  pipelineInfos;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  VkComputePipelineCreateInfo commonPipelineInfo;
  Environment objEnv;
  Resources res;
  AllocationCallbackRecorder recorder;
  DeterministicFailAllocator objAllocator;
  ulong local_370;
  SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_> local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  string *local_350;
  VkDevice local_348;
  Context *local_340;
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  local_338;
  size_t local_320;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  local_318;
  undefined1 local_2f8 [16];
  ProgramBinary local_2e8;
  VkShaderModule local_2c8;
  char *local_2c0;
  VkSpecializationInfo *local_2b8;
  VkPipelineLayout local_2b0;
  VkPipeline local_2a8;
  deInt32 local_2a0;
  Environment local_298;
  undefined1 local_260 [16];
  qpTestLog *local_250 [9];
  Handle<(vk::HandleType)16> local_208;
  ios_base local_1e8 [8];
  Handle<(vk::HandleType)15> local_1e0;
  AllocationCallbackRecorder local_e0;
  DeterministicFailAllocator local_80;
  
  __s = operator_new(0x20);
  local_350 = (string *)&__return_storage_ptr__->m_description;
  local_358 = &(__return_storage_ptr__->m_description).field_2;
  uVar10 = (long)__s + 8U;
  if ((long)__s + 8U < (long)__s + 0x20U) {
    uVar10 = (long)__s + 0x20U;
  }
  local_320 = (~(ulong)__s + uVar10 & 0xfffffffffffffff8) + 8;
  local_370 = 0;
  local_340 = context;
  do {
    memset(__s,0xde,local_320);
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_80,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_e0,&local_80.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
              );
    pPVar3 = context->m_platformInterface;
    pDVar5 = Context::getDeviceInterface(context);
    local_348 = Context::getDevice(context);
    local_298.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
    local_298.programBinaries = context->m_progCollection;
    local_298.device = local_348;
    local_298.allocationCallbacks =
         &local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_298.maxResourceConsumers = 4;
    local_260._0_8_ = context->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_260 + 8);
    local_298.vkp = pPVar3;
    local_298.vkd = pDVar5;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Trying to create ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," objects with ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," allocation",0xb);
    pcVar11 = "";
    if (local_370 != 1) {
      pcVar11 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,pcVar11,(ulong)(local_370 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_1e8);
    ComputePipeline::Resources::Resources((Resources *)local_260,&local_298,extraout_RDX);
    numPassingAllocs = (deUint32)local_370;
    ::vk::DeterministicFailAllocator::reset(&local_80,MODE_COUNT_AND_FAIL,numPassingAllocs);
    local_2f8._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
    local_2f8._8_8_ = (void *)0x0;
    local_2e8.m_format = 0;
    local_2e8.m_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    local_2e8.m_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.m_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x2000000000;
    local_2c8.m_internal = local_260._8_8_;
    local_2c0 = "main";
    local_2b8 = (VkSpecializationInfo *)0x0;
    local_2b0.m_internal = local_208.m_internal;
    local_2a8.m_internal = 0;
    local_2a0 = 0;
    std::vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>::
    vector(&local_338,4,(value_type *)local_2f8,(allocator_type *)&local_368);
    iVar4 = (*pDVar5->_vptr_DeviceInterface[0x31])
                      (pDVar5,local_348,local_1e0.m_internal,4,
                       local_338.
                       super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       &local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,__s);
    local_348 = (VkDevice)CONCAT44(local_348._4_4_,iVar4);
    local_318.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_318.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar14 = 0;
    do {
      object.m_internal = *(deUint64 *)((long)__s + lVar14 * 8);
      if (object.m_internal != 0) {
        pMVar6 = (Move<vk::Handle<(vk::HandleType)18>_> *)operator_new(0x20);
        CVar7 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>(object);
        (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
             (deUint64)CVar7.object.m_internal;
        (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
             local_298.vkd;
        (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
             local_298.device;
        (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
             local_298.allocationCallbacks;
        local_368.m_state = (SharedPtrStateBase *)0x0;
        local_368.m_ptr = pMVar6;
        local_368.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_368.m_state)->strongRefCount = 0;
        (local_368.m_state)->weakRefCount = 0;
        (local_368.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d53360;
        local_368.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pMVar6;
        (local_368.m_state)->strongRefCount = 1;
        (local_368.m_state)->weakRefCount = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>>>>
                    *)&local_318,&local_368);
        if (local_368.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_368.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_368.m_ptr = (Move<vk::Handle<(vk::HandleType)18>_> *)0x0;
            (*(local_368.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_368.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_368.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_368.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_368.m_state = (SharedPtrStateBase *)0x0;
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    if (local_338.
        super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.
                      super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_338.
                            super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_338.
                            super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&local_318);
    ComputePipeline::Resources::~Resources((Resources *)local_260);
    context = local_340;
    if ((VkResult)local_348 == 0) {
      local_260._0_8_ = local_340->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_260 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Construction of all objects succeeded! ",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1e8);
      iVar4 = 2;
    }
    else {
      iVar4 = 5;
      bVar15 = 3 < local_370;
      if (!bVar15) {
        uVar10 = local_370;
        if (*(long *)((long)__s + local_370 * 8) == 0) {
          do {
            uVar8 = uVar10;
            bVar15 = 2 < uVar8;
            if (uVar8 == 3) goto LAB_0042e083;
            uVar10 = uVar8 + 1;
          } while (*(long *)((long)__s + uVar8 * 8 + 8) == 0);
          bVar15 = 2 < uVar8;
        }
        local_260._0_8_ = local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Some object handles weren\'t set to NULL","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_358;
        std::__cxx11::string::_M_construct<char*>
                  (local_350,local_260._0_8_,
                   (long)(ProgramFormat *)local_260._0_8_ + local_260._8_8_);
        if ((ProgramBinary *)local_260._0_8_ != (ProgramBinary *)local_250) {
          operator_delete((void *)local_260._0_8_,(ulong)((long)&local_250[0]->flags + 1));
        }
        iVar4 = 1;
      }
LAB_0042e083:
      context = local_340;
      if (bVar15) {
        if ((VkResult)local_348 == VK_ERROR_OUT_OF_HOST_MEMORY) {
          bVar15 = ::vk::validateAndLog(local_340->m_testCtx->m_log,&local_e0,0);
          iVar4 = 0;
          if (bVar15) goto LAB_0042e2cb;
          local_260._0_8_ = local_250;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_260,"Invalid allocation callback","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_358;
          std::__cxx11::string::_M_construct<char*>
                    (local_350,local_260._0_8_,
                     (long)(ProgramFormat *)local_260._0_8_ + local_260._8_8_);
          pqVar12 = local_250[0];
          pPVar13 = (ProgramBinary *)local_260._0_8_;
          if ((ProgramBinary *)local_260._0_8_ != (ProgramBinary *)local_250) goto LAB_0042e2bd;
        }
        else {
          local_338.
          super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)::vk::getResultName((VkResult)local_348);
          de::toString<char_const*>((string *)local_2f8,(de *)&local_338,value);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0xafa9e8);
          local_260._0_8_ = local_250;
          pPVar13 = (ProgramBinary *)(plVar9 + 2);
          if ((ProgramBinary *)*plVar9 == pPVar13) {
            local_250[0] = *(qpTestLog **)pPVar13;
            local_250[1]._0_4_ = *(undefined4 *)(plVar9 + 3);
            local_250[1]._4_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
          }
          else {
            local_250[0] = *(qpTestLog **)pPVar13;
            local_260._0_8_ = (ProgramBinary *)*plVar9;
          }
          local_260._8_8_ = plVar9[1];
          *plVar9 = (long)pPVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_358;
          std::__cxx11::string::_M_construct<char*>
                    (local_350,local_260._0_8_,
                     (long)(ProgramFormat *)local_260._0_8_ + local_260._8_8_);
          if ((ProgramBinary *)local_260._0_8_ != (ProgramBinary *)local_250) {
            operator_delete((void *)local_260._0_8_,(ulong)((long)&local_250[0]->flags + 1));
          }
          if ((ProgramBinary *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) != &local_2e8) {
            pqVar12 = (qpTestLog *)CONCAT44(local_2e8._4_4_,local_2e8.m_format);
            pPVar13 = (ProgramBinary *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_);
LAB_0042e2bd:
            operator_delete(pPVar13,(ulong)((long)&pqVar12->flags + 1));
          }
        }
        iVar4 = 1;
      }
    }
LAB_0042e2cb:
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_e0);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&local_80);
    if (iVar4 != 0) {
      bVar15 = iVar4 == 2 || iVar4 == 0;
      goto LAB_0042e32e;
    }
    local_370 = local_370 + 1;
    if (local_370 == 5) {
      bVar15 = true;
      numPassingAllocs = 1;
LAB_0042e32e:
      operator_delete(__s,0x20);
      if (bVar15) {
        local_260._0_8_ = (ProgramBinary *)local_250;
        if (numPassingAllocs == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_260,"Allocation callbacks not called","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_358;
          std::__cxx11::string::_M_construct<char*>
                    (local_350,local_260._0_8_,(long)(qpTestLog **)local_260._0_8_ + local_260._8_8_
                    );
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Ok","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_358;
          std::__cxx11::string::_M_construct<char*>
                    (local_350,local_260._0_8_,(long)(qpTestLog **)local_260._0_8_ + local_260._8_8_
                    );
        }
        if ((ProgramBinary *)local_260._0_8_ != (ProgramBinary *)local_250) {
          operator_delete((void *)local_260._0_8_,(ulong)((long)&local_250[0]->flags + 1));
        }
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}